

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StridedArrayView.h
# Opt level: O0

ElementType __thiscall
Corrade::Containers::StridedArrayView<1U,_const_long_long>::operator[]
          (StridedArrayView<1U,_const_long_long> *this,size_t i)

{
  ostream *output;
  Debug *pDVar1;
  longlong *plVar2;
  Flags local_41;
  Error local_40;
  size_t local_18;
  size_t i_local;
  StridedArrayView<1U,_const_long_long> *this_local;
  
  local_18 = i;
  i_local = (size_t)this;
  if ((this->_size)._data[0] <= i) {
    output = Utility::Error::defaultOutput();
    EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_41);
    Utility::Error::Error(&local_40,output,local_41);
    pDVar1 = Utility::Debug::operator<<
                       (&local_40.super_Debug,"Containers::StridedArrayView::operator[](): index");
    pDVar1 = Utility::Debug::operator<<(pDVar1,local_18);
    pDVar1 = Utility::Debug::operator<<(pDVar1,"out of range for");
    pDVar1 = Utility::Debug::operator<<(pDVar1,(this->_size)._data[0]);
    Utility::Debug::operator<<(pDVar1,"elements");
    Utility::Error::~Error(&local_40);
    abort();
  }
  plVar2 = Implementation::StridedElement<1U,_const_long_long>::get
                     (this->_data,&this->_size,&this->_stride,i);
  return plVar2;
}

Assistant:

auto StridedArrayView<dimensions, T>::operator[](const std::size_t i) const -> ElementType {
    CORRADE_DEBUG_ASSERT(i < _size._data[0], "Containers::StridedArrayView::operator[](): index" << i << "out of range for" << _size._data[0] << "elements", (Implementation::StridedElement<dimensions, T>::get(_data, _size, _stride, i)));
    return Implementation::StridedElement<dimensions, T>::get(_data, _size, _stride, i);
}